

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

int stb_vorbis_seek_frame(stb_vorbis *f,uint sample_number)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  int iVar6;
  int64_t iVar7;
  int iVar8;
  uint loc;
  STBVorbisError SVar9;
  uint uVar10;
  uint32 uVar11;
  ulong uVar12;
  uint32 *end_00;
  bool bVar13;
  double dVar14;
  double dVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  uint end;
  ProbedPage left;
  int left_end;
  int mode;
  int right_end;
  uint local_84;
  ProbedPage local_80;
  uint local_74;
  uint32 local_70;
  ProbedPage local_6c;
  ulong local_60;
  int local_54;
  double local_50;
  double local_48;
  double local_40;
  int local_34;
  
  uVar2 = stb_vorbis_stream_length_in_samples(f);
  if (uVar2 == 0) {
    SVar9 = VORBIS_seek_without_length;
  }
  else {
    SVar9 = VORBIS_seek_invalid;
    if (sample_number <= uVar2) {
      uVar2 = f->blocksize_1 - f->blocksize_0 >> 2;
      end_00 = (uint32 *)(ulong)(sample_number - uVar2);
      if (sample_number < uVar2) {
        end_00 = (uint32 *)0x0;
      }
      local_80.last_decoded_sample = (f->p_first).last_decoded_sample;
      local_80.page_start = (f->p_first).page_start;
      local_80.page_end = (f->p_first).page_end;
      do {
        if (local_80.last_decoded_sample != 0xffffffff) {
          uVar2 = (uint)end_00;
          if (uVar2 <= local_80.last_decoded_sample) {
            set_file_offset(f,f->first_audio_page_offset);
            f->previous_length = 0;
            f->first_decode = '\x01';
            f->next_seg = -1;
            iVar3 = vorbis_pump_first_frame(f);
            goto joined_r0x0011dec1;
          }
          uVar4 = (f->p_last).page_start;
          uVar12 = (ulong)uVar4;
          if (local_80.page_end == uVar4) goto LAB_0011d9b8;
          local_70 = (f->p_last).page_end;
          local_40 = (double)(long)end_00;
          local_74 = (f->p_last).last_decoded_sample;
          uVar4 = 0;
          local_50 = 0.0;
          local_48 = 0.0;
          goto LAB_0011dc80;
        }
        set_file_offset(f,local_80.page_end);
        iVar3 = get_seek_page_info(f,&local_80);
      } while (iVar3 != 0);
LAB_0011d948:
      set_file_offset(f,f->first_audio_page_offset);
      f->previous_length = 0;
      f->first_decode = '\x01';
      f->next_seg = -1;
      vorbis_pump_first_frame(f);
      SVar9 = VORBIS_seek_failed;
    }
  }
  goto LAB_0011d984;
  while( true ) {
    uVar4 = uVar4 + 1;
    if (local_80.page_end == (uint)uVar12) break;
LAB_0011dc80:
    uVar10 = (int)uVar12 - local_80.page_end;
    local_60 = uVar12;
    if (uVar10 < 0x10001) {
      set_file_offset(f,local_80.page_end);
    }
    else {
      if (uVar4 < 2) {
        if (uVar4 == 0) {
          local_50 = (double)(local_70 - local_80.page_start) / (double)local_74;
          dVar15 = (double)(uVar2 - local_80.last_decoded_sample) * local_50 +
                   (double)(local_80._0_8_ & 0xffffffff);
        }
        else {
          dVar15 = (local_40 - (double)local_6c.last_decoded_sample) * local_50;
          dVar14 = 8000.0;
          if (8000.0 <= dVar15) {
            dVar14 = dVar15;
          }
          dVar15 = (double)(~-(ulong)(0.0 <= dVar15) & (ulong)dVar15 |
                           (ulong)dVar14 & -(ulong)(0.0 <= dVar15));
          uVar16 = 0;
          uVar17 = 0xc0bf4000;
          if (dVar15 <= -8000.0) {
            uVar16 = SUB84(dVar15,0);
            uVar17 = (undefined4)((ulong)dVar15 >> 0x20);
          }
          dVar15 = (double)(~-(ulong)(dVar15 < 0.0) & (ulong)dVar15 |
                           CONCAT44(uVar17,uVar16) & -(ulong)(dVar15 < 0.0));
          dVar15 = dVar15 + dVar15 + local_48;
        }
        local_48 = (double)((int)uVar12 - 0x10000);
        dVar14 = (double)local_80.page_end;
        if ((double)local_80.page_end <= dVar15) {
          dVar14 = dVar15;
        }
        if (dVar14 <= local_48) {
          local_48 = dVar14;
        }
        loc = (uint)(long)local_48;
      }
      else {
        loc = (local_80.page_end + (uVar10 >> 1)) - 0x8000;
      }
      set_file_offset(f,loc);
      uVar11 = vorbis_find_page(f,(uint32 *)0x0,(uint32 *)0x0);
      if (uVar11 == 0) goto LAB_0011d948;
    }
    while( true ) {
      iVar3 = get_seek_page_info(f,&local_6c);
      if (iVar3 == 0) goto LAB_0011d948;
      if (local_6c.last_decoded_sample != 0xffffffff) break;
      set_file_offset(f,local_6c.page_end);
    }
    uVar12 = local_60;
    if (local_6c.page_start == (uint)local_60) {
      if ((1 < uVar4) || (uVar10 < 0x10001)) break;
    }
    else if (uVar2 < local_6c.last_decoded_sample) {
      local_70 = local_6c.page_end;
      local_74 = local_6c.last_decoded_sample;
      uVar12 = (ulong)local_6c.page_start;
    }
    else {
      local_80.last_decoded_sample = local_6c.last_decoded_sample;
      local_80._0_8_ = CONCAT44(local_6c.page_end,local_6c.page_start);
    }
  }
LAB_0011d9b8:
  uVar11 = local_80.page_start;
  set_file_offset(f,local_80.page_start);
  iVar3 = start_page(f);
  SVar9 = VORBIS_seek_failed;
  if (iVar3 != 0) {
    uVar2 = f->end_seg_with_known_loc;
    end_00 = &local_84;
    do {
      uVar12 = (ulong)uVar2;
      uVar4 = uVar2 + 1;
      while (uVar10 = (uint)uVar12, 0 < (int)uVar10) {
        uVar4 = uVar4 - 1;
        lVar1 = uVar12 - 1;
        uVar12 = uVar12 - 1;
        if (f->segments[lVar1] != 0xff) goto LAB_0011de63;
      }
      if ((f->page_flag & 1) == 0) {
        uVar4 = (int)uVar2 >> 0x1f & uVar2;
LAB_0011de63:
        f->current_loc_valid = 0;
        f->last_seg = 0;
        f->valid_bits = 0;
        f->packet_bytes = 0;
        f->bytes_in_seg = '\0';
        f->previous_length = 0;
        f->next_seg = uVar4;
        if (0 < (int)uVar10) {
          uVar12 = 0;
          do {
            skip(f,(uint)f->segments[uVar12]);
            uVar12 = uVar12 + 1;
          } while ((uVar10 & 0x7fffffff) != uVar12);
        }
        iVar3 = vorbis_pump_first_frame(f);
joined_r0x0011dec1:
        if (iVar3 == 0) {
          return 0;
        }
        SVar9 = VORBIS_seek_failed;
        if (sample_number < f->current_loc) break;
        local_60 = (ulong)(uint)(f->blocksize_1 * 3 - f->blocksize_0 >> 2);
        do {
          if (sample_number <= f->current_loc) {
            if (f->current_loc != sample_number) {
              f->error = VORBIS_seek_failed;
              return 0;
            }
            return 1;
          }
          iVar3 = vorbis_decode_initial
                            (f,(int *)&local_80,(int *)&local_6c,(int *)&local_84,&local_34,
                             &local_54);
          if (iVar3 == 0) {
LAB_0011dbf2:
            f->error = VORBIS_seek_failed;
            bVar13 = false;
            end_00 = (uint32 *)0x0;
          }
          else {
            iVar6 = ilog(f->mode_count + -1);
            bVar13 = f->mode_config[local_54].blockflag != '\0';
            iVar8 = iVar6 + (uint)bVar13 * 2 + 8;
            iVar6 = iVar6 + (uint)bVar13 * 2 + 0xf;
            if (-1 < iVar8) {
              iVar6 = iVar8;
            }
            iVar6 = iVar6 >> 3;
            f->bytes_in_seg = f->bytes_in_seg + (char)iVar6;
            f->packet_bytes = f->packet_bytes - iVar6;
            skip(f,-iVar6);
            iVar6 = f->next_seg;
            if (iVar6 == -1) {
              iVar6 = f->segment_count;
            }
            f->next_seg = iVar6 + -1;
            f->valid_bits = 0;
            if (iVar3 == 0) goto LAB_0011dbf2;
            uVar2 = (local_84 - local_80.page_start) + f->current_loc;
            if (sample_number < uVar2) {
              end_00 = (uint32 *)0x1;
              bVar13 = false;
            }
            else {
              if (sample_number < (int)local_60 + uVar2) {
                vorbis_pump_first_frame(f);
              }
              else {
                f->current_loc = uVar2;
                f->previous_length = 0;
                maybe_start_packet(f);
                do {
                  iVar3 = get8_packet_raw(f);
                } while (iVar3 != -1);
              }
              bVar13 = true;
            }
          }
          if (!bVar13) {
            return (int)end_00;
          }
        } while( true );
      }
      if ((uVar11 < 0x10000) ||
         (uVar2 = uVar11 - 0x10000, uVar11 - 0x10000 < f->first_audio_page_offset)) {
        uVar2 = f->first_audio_page_offset;
      }
      do {
        do {
          set_file_offset(f,uVar2);
          uVar5 = vorbis_find_page(f,end_00,(uint32 *)0x0);
          if (uVar5 == 0) goto LAB_0011d948;
          uVar2 = local_84;
        } while (local_84 < uVar11);
        if (f->stream == (uint8 *)0x0) {
          iVar7 = (*f->f->seek)(f->f->data,0,1);
          uVar4 = (int)iVar7 - f->f_start;
        }
        else {
          uVar4 = (int)f->stream - *(int *)&f->stream_start;
        }
        uVar2 = local_84;
      } while (uVar11 <= uVar4);
      if (f->stream == (uint8 *)0x0) {
        iVar7 = (*f->f->seek)(f->f->data,0,1);
        uVar11 = (int)iVar7 - f->f_start;
      }
      else {
        uVar11 = (int)f->stream - *(int *)&f->stream_start;
      }
      iVar3 = start_page(f);
      if (iVar3 == 0) goto LAB_0011d948;
      uVar2 = f->segment_count - 1;
    } while( true );
  }
LAB_0011d984:
  f->error = SVar9;
  return 0;
}

Assistant:

int stb_vorbis_seek_frame(stb_vorbis *f, unsigned int sample_number)
{
   uint32 max_frame_samples;

   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   // fast page-level search
   if (!seek_to_sample_coarse(f, sample_number))
      return 0;

   assert(f->current_loc_valid);
   assert(f->current_loc <= sample_number);

   // linear search for the relevant packet
   max_frame_samples = (f->blocksize_1*3 - f->blocksize_0) >> 2;
   while (f->current_loc < sample_number) {
      int left_start, left_end, right_start, right_end, mode, frame_samples;
      if (!peek_decode_initial(f, &left_start, &left_end, &right_start, &right_end, &mode))
         return error(f, VORBIS_seek_failed);
      // calculate the number of samples returned by the next frame
      frame_samples = right_start - left_start;
      if (f->current_loc + frame_samples > sample_number) {
         return 1; // the next frame will contain the sample
      } else if (f->current_loc + frame_samples + max_frame_samples > sample_number) {
         // there's a chance the frame after this could contain the sample
         vorbis_pump_first_frame(f);
      } else {
         // this frame is too early to be relevant
         f->current_loc += frame_samples;
         f->previous_length = 0;
         maybe_start_packet(f);
         flush_packet(f);
      }
   }
   // the next frame should start with the sample
   if (f->current_loc != sample_number) return error(f, VORBIS_seek_failed);
   return 1;
}